

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O3

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint32_t u)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (u != 1) {
    if (u == 0) {
      this->digits_[0] = 0;
    }
    else {
      if ((this->count_ != 1) || (this->digits_[0] != 1)) {
        if (this->count_ == 0) {
          return this;
        }
        uVar4 = 0;
        uVar2 = 0;
        do {
          uVar4 = (this->digits_[uVar2] & 0xffffffff) * (ulong)u + uVar4;
          uVar3 = (uVar4 >> 0x20) + (this->digits_[uVar2] >> 0x20) * (ulong)u;
          this->digits_[uVar2] = uVar3 << 0x20 | uVar4 & 0xffffffff;
          uVar4 = uVar3 >> 0x20;
          uVar2 = uVar2 + 1;
          uVar1 = this->count_;
        } while (uVar2 < uVar1);
        if (uVar3 >> 0x20 == 0) {
          return this;
        }
        if (uVar1 < 0x1a0) {
          this->count_ = uVar1 + 1;
          this->digits_[uVar1] = uVar4;
          return this;
        }
        __assert_fail("count_ < kCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                      ,0xeb,"void rapidjson::internal::BigInteger::PushBack(Type)");
      }
      this->digits_[0] = (ulong)u;
    }
    this->count_ = 1;
  }
  return this;
}

Assistant:

BigInteger& operator*=(uint32_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            const uint64_t c = digits_[i] >> 32;
            const uint64_t d = digits_[i] & 0xFFFFFFFF;
            const uint64_t uc = u * c;
            const uint64_t ud = u * d;
            const uint64_t p0 = ud + k;
            const uint64_t p1 = uc + (p0 >> 32);
            digits_[i] = (p0 & 0xFFFFFFFF) | (p1 << 32);
            k = p1 >> 32;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }